

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> __thiscall
slang::parsing::Parser::
parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseCoverpoint(std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::syntax::DataTypeSyntax*,slang::syntax::NamedLabelSyntax*)::__0>
          (Parser *this,TokenKind endKind,Token *endToken,SyntaxKind parentKind,
          anon_class_8_1_8991fb9c *parseFunc)

{
  SourceRange range;
  string_view arg;
  optional<slang::DiagCode> diagCode;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> sVar1;
  bool bVar2;
  int iVar3;
  enable_if_t<is_constructible_v<decay_t<const_DiagCode_&>,_const_slang::DiagCode_&>,_optional<decay_t<const_DiagCode_&>_>_>
  eVar4;
  SyntaxNode *pSVar5;
  undefined4 extraout_var;
  Token *in_RDX;
  size_t extraout_RDX;
  TokenKind in_SI;
  ParserBase *in_RDI;
  Token TVar6;
  SourceRange SVar7;
  string_view sVar8;
  pair<slang::parsing::Token,_slang::parsing::Token> *lastBlock;
  Diagnostic *diag;
  MemberSyntax *member;
  TokenKind kind;
  bool anyLocalModules;
  bool errored;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  ParserBase *in_stack_fffffffffffffdd8;
  Diagnostic *in_stack_fffffffffffffde0;
  SourceLocation in_stack_fffffffffffffde8;
  Token *in_stack_fffffffffffffdf0;
  SourceLocation in_stack_fffffffffffffdf8;
  SourceLocation in_stack_fffffffffffffe00;
  SourceLocation in_stack_fffffffffffffe08;
  SourceLocation in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  SourceLocation in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe68;
  TokenKind kind_00;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  ParserBase *in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeb6;
  _Storage<slang::DiagCode,_true> local_146;
  undefined2 local_142;
  SourceLocation local_140;
  undefined4 local_134;
  SourceLocation local_130;
  undefined4 local_124;
  pair<slang::parsing::Token,_slang::parsing::Token> *local_120;
  Token local_118;
  string_view local_108;
  undefined8 local_f8;
  Info *local_f0;
  SourceRange local_e8;
  undefined4 local_d4;
  SourceLocation local_d0;
  undefined8 local_c8;
  MemberSyntax *local_c0;
  Token local_a8;
  TokenKind local_94;
  byte local_92;
  byte local_91;
  SmallVectorBase<slang::syntax::MemberSyntax_*> local_90 [3];
  Token *local_28;
  TokenKind local_1a;
  pointer local_10;
  __extent_storage<18446744073709551615UL> local_8;
  
  local_28 = in_RDX;
  local_1a = in_SI;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL>::SmallVector
            ((SmallVector<slang::syntax::MemberSyntax_*,_8UL> *)0x6d279e);
  sVar8._M_str = in_stack_fffffffffffffe20;
  sVar8._M_len = in_stack_fffffffffffffe28;
  local_91 = 0;
  local_92 = 0;
  while( true ) {
    TVar6 = ParserBase::peek(in_stack_fffffffffffffdd8);
    kind_00 = (TokenKind)((ulong)in_stack_fffffffffffffe68 >> 0x30);
    local_a8.kind = TVar6.kind;
    local_94 = local_a8.kind;
    local_a8 = TVar6;
    if ((local_a8.kind == EndOfFile) || (local_a8.kind == local_1a)) break;
    local_c0 = parseCoverpoint::anon_class_8_1_8991fb9c::operator()
                         ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffde0,
                          (SyntaxKind)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(bool *)0x6d2863);
    if (local_c0 == (MemberSyntax *)0x0) {
      in_stack_fffffffffffffe77 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(Unknown);
      if ((bool)in_stack_fffffffffffffe77) {
        local_d4 = 0xb80005;
        TVar6 = ParserBase::peek(in_stack_fffffffffffffdd8);
        local_f0 = TVar6.info;
        in_stack_fffffffffffffe68 = TVar6._0_8_;
        local_f8 = in_stack_fffffffffffffe68;
        SVar7 = Token::range((Token *)in_stack_fffffffffffffe00);
        range.endLoc = in_stack_fffffffffffffe08;
        range.startLoc = in_stack_fffffffffffffe00;
        local_e8 = SVar7;
        in_stack_fffffffffffffe30 =
             (SourceLocation)
             ParserBase::addDiag((ParserBase *)in_stack_fffffffffffffdf8,
                                 in_stack_fffffffffffffe10._4_4_,range);
        local_d0 = in_stack_fffffffffffffe30;
        TVar6 = ParserBase::peek(in_stack_fffffffffffffdd8);
        local_118 = TVar6;
        sVar8 = Token::valueText(in_stack_fffffffffffffdf0);
        arg._M_str = (char *)in_stack_fffffffffffffe30;
        arg._M_len = sVar8._M_len;
        local_108 = sVar8;
        Diagnostic::operator<<((Diagnostic *)sVar8._M_str,arg);
        local_91 = 1;
        local_120 = ParserBase::getLastPoppedDelims(in_RDI);
        bVar2 = Token::operator_cast_to_bool((Token *)0x6d2aae);
        if (bVar2) {
          bVar2 = Token::operator_cast_to_bool((Token *)0x6d2ad2);
          if (bVar2) {
            local_124 = 0xc10005;
            in_stack_fffffffffffffe08 = local_d0;
            in_stack_fffffffffffffe10 = Token::location(&local_120->first);
            local_130 = in_stack_fffffffffffffe10;
            Diagnostic::addNote(in_stack_fffffffffffffde0,
                                SUB84((ulong)in_stack_fffffffffffffdf0 >> 0x20,0),
                                in_stack_fffffffffffffde8);
            local_134 = 0xc00005;
            in_stack_fffffffffffffdf8 = local_d0;
            in_stack_fffffffffffffe00 = Token::location(&local_120->second);
            local_140 = in_stack_fffffffffffffe00;
            Diagnostic::addNote(in_stack_fffffffffffffde0,
                                SUB84((ulong)in_stack_fffffffffffffdf0 >> 0x20,0),
                                in_stack_fffffffffffffde8);
          }
        }
      }
      if ((local_91 & 1) == 0) {
        eVar4 = std::make_optional<slang::DiagCode_const&>((DiagCode *)in_stack_fffffffffffffdd8);
        local_146 = eVar4.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::DiagCode>._M_payload;
        local_142 = eVar4.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::DiagCode>._4_2_;
      }
      else {
        std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)&local_146);
      }
      diagCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
      super__Optional_payload_base<slang::DiagCode>._M_payload._M_value.code = local_142;
      diagCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
      super__Optional_payload_base<slang::DiagCode>._M_payload._M_value.subsystem =
           local_146._M_value.code;
      diagCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
      super__Optional_payload_base<slang::DiagCode>._4_2_ = in_stack_fffffffffffffeb6;
      ParserBase::skipToken(in_stack_fffffffffffffea8,diagCode);
      local_91 = 1;
    }
    else {
      checkMemberAllowed((Parser *)in_stack_fffffffffffffe30,(SyntaxNode *)sVar8._M_len,
                         sVar8._M_str._4_4_);
      SmallVectorBase<slang::syntax::MemberSyntax_*>::push_back
                ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)in_stack_fffffffffffffde0,
                 (MemberSyntax **)in_stack_fffffffffffffdd8);
      local_91 = 0;
      local_c8 = 0;
      pSVar5 = std::exchange<slang::syntax::SyntaxNode_const*,decltype(nullptr)>
                         ((SyntaxNode **)in_stack_fffffffffffffde0,&in_stack_fffffffffffffdd8->alloc
                         );
      (local_c0->super_SyntaxNode).previewNode = pSVar5;
    }
  }
  if ((local_92 & 1) != 0) {
    SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pop_back((SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                *)in_stack_fffffffffffffde0);
  }
  TVar6 = ParserBase::expect((ParserBase *)
                             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),kind_00);
  *local_28 = TVar6;
  iVar3 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    (local_90,(EVP_PKEY_CTX *)in_RDI->alloc,TVar6._0_8_);
  local_10 = (pointer)CONCAT44(extraout_var,iVar3);
  local_8._M_extent_value = extraout_RDX;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL>::~SmallVector
            ((SmallVector<slang::syntax::MemberSyntax_*,_8UL> *)0x6d2cd5);
  sVar1._M_extent._M_extent_value = local_8._M_extent_value;
  sVar1._M_ptr = local_10;
  return sVar1;
}

Assistant:

std::span<TMember*> Parser::parseMemberList(TokenKind endKind, Token& endToken,
                                            SyntaxKind parentKind, TParseFunc&& parseFunc) {
    SmallVector<TMember*, 8> members;
    bool errored = false;
    bool anyLocalModules = false;

    while (true) {
        auto kind = peek().kind;
        if (kind == TokenKind::EndOfFile || kind == endKind)
            break;

        auto member = parseFunc(parentKind, anyLocalModules);
        if (member) {
            checkMemberAllowed(*member, parentKind);
            members.push_back(member);
            errored = false;

            member->previewNode = std::exchange(previewNode, nullptr);
        }
        else {
            if (isCloseDelimOrKeyword(kind)) {
                auto& diag = addDiag(diag::UnexpectedEndDelim, peek().range());
                diag << peek().valueText();
                errored = true;

                auto& lastBlock = getLastPoppedDelims();
                if (lastBlock.first && lastBlock.second) {
                    diag.addNote(diag::NoteLastBlockStarted, lastBlock.first.location());
                    diag.addNote(diag::NoteLastBlockEnded, lastBlock.second.location());
                }
            }

            skipToken(errored ? std::nullopt : std::make_optional(diag::ExpectedMember));
            errored = true;
        }
    }

    if (anyLocalModules)
        moduleDeclStack.pop_back();

    endToken = expect(endKind);
    return members.copy(alloc);
}